

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RelationsAnalyzer.cpp
# Opt level: O0

pair<const_llvm::Value_*,_bool>
dg::vr::getCompared(ValueRelations *graph,ICmpInst *icmp,Value *from)

{
  __normal_iterator<const_llvm::Value_*const_*,_std::vector<const_llvm::Value_*,_std::allocator<const_llvm::Value_*>_>_>
  __last;
  bool bVar1;
  size_type sVar2;
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_00;
  undefined8 uVar3;
  pair<const_llvm::Value_*,_bool> pVar4;
  vector<const_llvm::Value_*,_std::allocator<const_llvm::Value_*>_> *froms;
  Value *op;
  const_iterator __end2;
  const_iterator __begin2;
  initializer_list<const_llvm::Value_*> *__range2;
  Value *op2;
  Value *op1;
  undefined4 in_stack_ffffffffffffff28;
  uint in_stack_ffffffffffffff2c;
  initializer_list<const_llvm::Value_*> *in_stack_ffffffffffffff30;
  undefined7 in_stack_ffffffffffffff38;
  bool in_stack_ffffffffffffff3f;
  undefined4 in_stack_ffffffffffffff40;
  int iVar5;
  undefined4 in_stack_ffffffffffffff44;
  const_iterator in_stack_ffffffffffffff48;
  vector<const_llvm::Value_*,_std::allocator<const_llvm::Value_*>_> local_98;
  vector<const_llvm::Value_*,_std::allocator<const_llvm::Value_*>_> *local_80;
  Value *local_78;
  const_iterator local_70;
  const_iterator local_68;
  Value *local_60;
  ValueRelations *local_58;
  initializer_list<const_llvm::Value_*> local_50;
  initializer_list<const_llvm::Value_*> *this;
  ValueRelations *rels;
  Value *local_30 [4];
  pair<const_llvm::Value_*,_bool> local_10;
  
  local_30[0] = llvm::CmpInst::getOperand
                          ((CmpInst *)in_stack_ffffffffffffff30,in_stack_ffffffffffffff2c);
  local_58 = (ValueRelations *)
             llvm::CmpInst::getOperand
                       ((CmpInst *)in_stack_ffffffffffffff30,in_stack_ffffffffffffff2c);
  local_60 = local_30[0];
  local_50._M_array = &local_60;
  local_50._M_len = 2;
  this = &local_50;
  rels = local_58;
  local_68 = std::initializer_list<const_llvm::Value_*>::begin(this);
  local_70 = std::initializer_list<const_llvm::Value_*>::end(in_stack_ffffffffffffff30);
  for (; local_68 != local_70; local_68 = local_68 + 1) {
    local_78 = *local_68;
    RelationsAnalyzer::getFroms(rels,(V)this);
    local_80 = &local_98;
    std::vector<const_llvm::Value_*,_std::allocator<const_llvm::Value_*>_>::begin
              ((vector<const_llvm::Value_*,_std::allocator<const_llvm::Value_*>_> *)
               CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28));
    std::vector<const_llvm::Value_*,_std::allocator<const_llvm::Value_*>_>::end
              ((vector<const_llvm::Value_*,_std::allocator<const_llvm::Value_*>_> *)
               CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28));
    __last._M_current._4_4_ = in_stack_ffffffffffffff44;
    __last._M_current._0_4_ = in_stack_ffffffffffffff40;
    std::
    find<__gnu_cxx::__normal_iterator<llvm::Value_const*const*,std::vector<llvm::Value_const*,std::allocator<llvm::Value_const*>>>,llvm::Value_const*>
              ((__normal_iterator<const_llvm::Value_*const_*,_std::vector<const_llvm::Value_*,_std::allocator<const_llvm::Value_*>_>_>
                )in_stack_ffffffffffffff48._M_current,__last,
               (Value **)CONCAT17(in_stack_ffffffffffffff3f,in_stack_ffffffffffffff38));
    in_stack_ffffffffffffff48 =
         std::vector<const_llvm::Value_*,_std::allocator<const_llvm::Value_*>_>::end
                   ((vector<const_llvm::Value_*,_std::allocator<const_llvm::Value_*>_> *)
                    CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28));
    bVar1 = __gnu_cxx::operator!=
                      ((__normal_iterator<const_llvm::Value_*const_*,_std::vector<const_llvm::Value_*,_std::allocator<const_llvm::Value_*>_>_>
                        *)in_stack_ffffffffffffff30,
                       (__normal_iterator<const_llvm::Value_*const_*,_std::vector<const_llvm::Value_*,_std::allocator<const_llvm::Value_*>_>_>
                        *)CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28));
    if (bVar1) {
      if (local_78 == local_30[0]) {
        sVar2 = std::vector<const_llvm::Value_*,_std::allocator<const_llvm::Value_*>_>::size
                          (local_80);
        in_stack_ffffffffffffff44 = CONCAT13(sVar2 < 2,(int3)in_stack_ffffffffffffff44);
        std::pair<const_llvm::Value_*,_bool>::pair<const_llvm::Value_*&,_bool,_true>
                  (&local_10,(Value **)&stack0xffffffffffffffc8,(bool *)&stack0xffffffffffffff47);
        iVar5 = 1;
      }
      else {
        sVar2 = std::vector<const_llvm::Value_*,_std::allocator<const_llvm::Value_*>_>::size
                          (local_80);
        in_stack_ffffffffffffff3f = sVar2 < 2;
        std::pair<const_llvm::Value_*,_bool>::pair<const_llvm::Value_*&,_bool,_true>
                  (&local_10,local_30,(bool *)&stack0xffffffffffffff3f);
        iVar5 = 1;
      }
    }
    else {
      iVar5 = 0;
    }
    std::vector<const_llvm::Value_*,_std::allocator<const_llvm::Value_*>_>::~vector
              ((vector<const_llvm::Value_*,_std::allocator<const_llvm::Value_*>_> *)
               CONCAT44(in_stack_ffffffffffffff44,iVar5));
    uVar3 = extraout_RDX;
    if (iVar5 != 0) goto LAB_001d1106;
    in_stack_ffffffffffffff40 = 0;
  }
  std::pair<const_llvm::Value_*,_bool>::pair<std::nullptr_t,_bool,_true>
            (&local_10,(void **)&stack0xffffffffffffff30,(bool *)&stack0xffffffffffffff2f);
  uVar3 = extraout_RDX_00;
LAB_001d1106:
  pVar4._9_7_ = (undefined7)((ulong)uVar3 >> 8);
  pVar4.second = local_10.second;
  pVar4.first = local_10.first;
  return pVar4;
}

Assistant:

std::pair<V, bool> getCompared(const ValueRelations &graph,
                               const llvm::ICmpInst *icmp,
                               const llvm::Value *from) {
    const auto *op1 = icmp->getOperand(0);
    const auto *op2 = icmp->getOperand(1);

    for (const auto *op : {op1, op2}) {
        const auto &froms = RelationsAnalyzer::getFroms(graph, op);
        if (std::find(froms.begin(), froms.end(), from) != froms.end()) {
            if (op == op1)
                return {op2, froms.size() <= 1};
            return {op1, froms.size() <= 1};
        }
    }
    return {nullptr, false};
}